

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O0

void __thiscall
TPZSkylMatrix<long_double>::TPZSkylMatrix(TPZSkylMatrix<long_double> *this,int64_t dim)

{
  int64_t in_RSI;
  TPZRegisterClassId *in_RDI;
  TPZVec<long_double_*> *unaff_retaddr;
  int64_t in_stack_ffffffffffffffa8;
  TPZVec<long_double_*> *in_stack_ffffffffffffffb0;
  int64_t in_stack_ffffffffffffffc0;
  void **in_stack_ffffffffffffffc8;
  TPZMatrix<long_double> *in_stack_ffffffffffffffd0;
  int64_t numelem;
  TPZRegisterClassId *copy;
  
  numelem = 0;
  copy = in_RDI;
  TPZRegisterClassId::TPZRegisterClassId<TPZSkylMatrix<long_double>>(in_RDI,0x21);
  TPZMatrix<long_double>::TPZMatrix
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
             (int64_t)in_RDI);
  *(undefined ***)in_RDI = &PTR__TPZSkylMatrix_02414be0;
  TPZVec<long_double_*>::TPZVec(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  TPZVec<long_double>::TPZVec((TPZVec<long_double> *)(in_RDI + 0x40),in_stack_ffffffffffffffa8);
  TPZVec<long_double_*>::Fill(unaff_retaddr,(longdouble **)copy,in_RSI,numelem);
  return;
}

Assistant:

TPZSkylMatrix<TVar>::TPZSkylMatrix(const int64_t dim )
: TPZRegisterClassId(&TPZSkylMatrix::ClassId),TPZMatrix<TVar>( dim, dim ), fElem(dim+1), fStorage(0)
{
	
	// Inicializa a diagonal (vazia).
	fElem.Fill(0);
}